

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O0

sljit_sw do_search_mark(sljit_sw *current,PCRE2_SPTR16 skip_arg)

{
  int iVar1;
  PCRE2_SPTR16 skip_arg_local;
  sljit_sw *current_local;
  
  skip_arg_local = (PCRE2_SPTR16)current;
  while( true ) {
    if (skip_arg_local == (PCRE2_SPTR16)0x0) {
      return 0;
    }
    if ((*(long *)(skip_arg_local + 4) == 0) &&
       (iVar1 = _pcre2_strcmp_16(skip_arg,*(PCRE2_SPTR16 *)(skip_arg_local + 8)), iVar1 == 0))
    break;
    skip_arg_local = *(PCRE2_SPTR16 *)skip_arg_local;
  }
  return *(sljit_sw *)(skip_arg_local + 0xc);
}

Assistant:

static sljit_sw SLJIT_FUNC do_search_mark(sljit_sw *current, PCRE2_SPTR skip_arg)
{
while (current != NULL)
  {
  switch (current[1])
    {
    case type_then_trap:
    break;

    case type_mark:
    if (PRIV(strcmp)(skip_arg, (PCRE2_SPTR)current[2]) == 0)
      return current[3];
    break;

    default:
    SLJIT_UNREACHABLE();
    break;
    }
  SLJIT_ASSERT(current[0] == 0 || current < (sljit_sw*)current[0]);
  current = (sljit_sw*)current[0];
  }
return 0;
}